

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_CtypeForCord_Test::
CppGeneratorTest_CtypeForCord_Test(CppGeneratorTest_CtypeForCord_Test *this)

{
  CppGeneratorTest_CtypeForCord_Test *this_local;
  
  CppGeneratorTest::CppGeneratorTest(&this->super_CppGeneratorTest);
  (this->super_CppGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CppGeneratorTest_CtypeForCord_Test_02a019c0;
  return;
}

Assistant:

TEST_F(CppGeneratorTest, CtypeForCord) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";

    message Foo {
      int32 bar = 1;
      bytes baz = 2 [ctype = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectNoErrors();
}